

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O3

int mtar_write_file_header(mtar_t *tar,char *name,size_t size)

{
  int iVar1;
  size_t sVar2;
  time_t tVar3;
  mtar_header_t h;
  mtar_header_t local_108;
  
  sVar2 = strlen(name);
  iVar1 = -9;
  if (sVar2 < 100) {
    memset(&local_108,0,0xe0);
    strcpy(local_108.name,name);
    local_108.type = 0x30;
    local_108.mode = 0x1b4;
    local_108.size = size;
    tVar3 = time((time_t *)0x0);
    local_108.mtime = (uint)tVar3;
    iVar1 = mtar_write_header(tar,&local_108);
  }
  return iVar1;
}

Assistant:

int mtar_write_file_header(mtar_t *tar, const char *name, size_t size) {
  mtar_header_t h;
  if (strlen(name) > MTAR_NAMEMAX)
    return MTAR_ENAMELONG;
  /* Build header */
  memset(&h, 0, sizeof(h));
  strcpy(h.name, name);
  h.size = size;
  h.type = MTAR_TREG;
  h.mode = 0664;
  h.mtime = time(NULL);
  /* Write header */
  return mtar_write_header(tar, &h);
}